

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLDocument::DeleteNode(XMLDocument *this,XMLNode *node)

{
  XMLNode *node_local;
  XMLDocument *this_local;
  
  if (node->_parent == (XMLNode *)0x0) {
    (*node->_memPool->_vptr_MemPool[5])();
    XMLNode::DeleteNode(node);
  }
  else {
    XMLNode::DeleteChild(node->_parent,node);
  }
  return;
}

Assistant:

void XMLDocument::DeleteNode( XMLNode* node )	{
    TIXMLASSERT( node );
    TIXMLASSERT(node->_document == this );
    if (node->_parent) {
        node->_parent->DeleteChild( node );
    }
    else {
        // Isn't in the tree.
        // Use the parent delete.
        // Also, we need to mark it tracked: we 'know'
        // it was never used.
        node->_memPool->SetTracked();
        // Call the static XMLNode version:
        XMLNode::DeleteNode(node);
    }
}